

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

uint Assimp::StandardShapes::MakeIcosahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  aiVector3t<float> local_100;
  aiVector3t<float> local_f0;
  aiVector3t<float> local_e0;
  aiVector3t<float> local_d0;
  aiVector3t<float> local_c0;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_90;
  aiVector3t<float> local_80;
  aiVector3t<float> local_70;
  aiVector3t<float> local_60;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc + 0x3c);
  local_d0 = (aiVector3t<float>)ZEXT812(0x3f8000003fcf1bbd);
  local_50 = ::operator/(&local_d0,1.9021131);
  local_60 = (aiVector3t<float>)ZEXT812(0x3f800000bfcf1bbd);
  local_d0 = ::operator/(&local_60,1.9021131);
  local_70 = (aiVector3t<float>)ZEXT812(0xbf8000003fcf1bbd);
  local_60 = ::operator/(&local_70,1.9021131);
  local_80 = (aiVector3t<float>)ZEXT812(0xbf800000bfcf1bbd);
  local_70 = ::operator/(&local_80,1.9021131);
  local_e0.z = 1.618034;
  local_e0.x = 1.0;
  local_e0.y = 0.0;
  local_80 = ::operator/(&local_e0,1.9021131);
  local_90.z = -1.618034;
  local_90.x = 1.0;
  local_90.y = 0.0;
  local_e0 = ::operator/(&local_90,1.9021131);
  local_a0.z = 1.618034;
  local_a0.x = -1.0;
  local_a0.y = 0.0;
  local_90 = ::operator/(&local_a0,1.9021131);
  local_b0.z = -1.618034;
  local_b0.x = -1.0;
  local_b0.y = 0.0;
  local_a0 = ::operator/(&local_b0,1.9021131);
  local_100.z = 1.0;
  local_100.x = 0.0;
  local_100.y = 1.618034;
  local_b0 = ::operator/(&local_100,1.9021131);
  local_c0.z = 1.0;
  local_c0.x = 0.0;
  local_c0.y = -1.618034;
  local_100 = ::operator/(&local_c0,1.9021131);
  local_f0.z = -1.0;
  local_f0.x = 0.0;
  local_f0.y = 1.618034;
  local_c0 = ::operator/(&local_f0,1.9021131);
  local_40.x = 0.0;
  local_40.y = -1.618034;
  local_40.z = -1.0;
  local_f0 = ::operator/(&local_40,1.9021131);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_b0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_e0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_c0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_f0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_e0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_d0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_b0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_d0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_c0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_a0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_a0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_f0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_c0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_b0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_d0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_b0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_c0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_f0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_f0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_e0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_60);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_d0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_a0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_70);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_d0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_b0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_80);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_90);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_c0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_e0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_a0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_f0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_a0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_e0);
  return 3;
}

Assistant:

unsigned int StandardShapes::MakeIcosahedron(std::vector<aiVector3D>& positions)
{
    positions.reserve(positions.size()+60);

    const ai_real t = ( ai_real( 1.0 )+ ai_real( 2.236067977 ) ) / ai_real( 2.0 );
    const ai_real s = std::sqrt(ai_real(1.0) + t*t);

    const aiVector3D v0  = aiVector3D(t,1.0, 0.0)/s;
    const aiVector3D v1  = aiVector3D(-t,1.0, 0.0)/s;
    const aiVector3D v2  = aiVector3D(t,-1.0, 0.0)/s;
    const aiVector3D v3  = aiVector3D(-t,-1.0, 0.0)/s;
    const aiVector3D v4  = aiVector3D(1.0, 0.0, t)/s;
    const aiVector3D v5  = aiVector3D(1.0, 0.0,-t)/s;
    const aiVector3D v6  = aiVector3D(-1.0, 0.0,t)/s;
    const aiVector3D v7  = aiVector3D(-1.0, 0.0,-t)/s;
    const aiVector3D v8  = aiVector3D(0.0, t, 1.0)/s;
    const aiVector3D v9  = aiVector3D(0.0,-t, 1.0)/s;
    const aiVector3D v10 = aiVector3D(0.0, t,-1.0)/s;
    const aiVector3D v11 = aiVector3D(0.0,-t,-1.0)/s;

    ADD_TRIANGLE(v0,v8,v4);
    ADD_TRIANGLE(v0,v5,v10);
    ADD_TRIANGLE(v2,v4,v9);
    ADD_TRIANGLE(v2,v11,v5);

    ADD_TRIANGLE(v1,v6,v8);
    ADD_TRIANGLE(v1,v10,v7);
    ADD_TRIANGLE(v3,v9,v6);
    ADD_TRIANGLE(v3,v7,v11);

    ADD_TRIANGLE(v0,v10,v8);
    ADD_TRIANGLE(v1,v8,v10);
    ADD_TRIANGLE(v2,v9,v11);
    ADD_TRIANGLE(v3,v11,v9);

    ADD_TRIANGLE(v4,v2,v0);
    ADD_TRIANGLE(v5,v0,v2);
    ADD_TRIANGLE(v6,v1,v3);
    ADD_TRIANGLE(v7,v3,v1);

    ADD_TRIANGLE(v8,v6,v4);
    ADD_TRIANGLE(v9,v4,v6);
    ADD_TRIANGLE(v10,v5,v7);
    ADD_TRIANGLE(v11,v7,v5);
    return 3;
}